

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitUtils.hpp
# Opt level: O3

CodeOp Indexing::CodeTree::CodeOp::getLitEnd(ILStruct *ils)

{
  CodeOp CVar1;
  
  CVar1._alternative = (CodeOp *)0x0;
  CVar1._content = (long)ils * 8 + 2;
  return CVar1;
}

Assistant:

static void setBits(uint64_t& bits, uint64_t data) {
    auto mask = bitmask64<lower, upper>();

    // shift `data` into position
    data <<= lower;

    // mask out upper bits of `data`
    // *probably* not strictly necessary if `data` always zero at `upper` and `above`,
    // but doesn't cost us much (~2 instructions) to put this sanity check here
    data &= mask;

    // actually set the bits
    IGNORE_MAYBE_UNINITIALIZED(
    bits &= ~mask;
    )
    bits |= data;
  }